

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  undefined4 *in_RDX;
  long in_RSI;
  uint *in_RDI;
  int over;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = 0;
  *in_RDI = 0;
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    *in_RDI = *in_RDI * 0x100 + (uint)*(byte *)(in_RSI + local_1c);
    if (0xc < *in_RDI) {
      local_20 = 1;
      *in_RDI = *in_RDI % 0xd;
    }
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = local_20;
  }
  secp256k1_scalar_verify((secp256k1_scalar *)0x102f8e);
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int i;
    int over = 0;
    *r = 0;
    for (i = 0; i < 32; i++) {
        *r = (*r * 0x100) + b32[i];
        if (*r >= EXHAUSTIVE_TEST_ORDER) {
            over = 1;
            *r %= EXHAUSTIVE_TEST_ORDER;
        }
    }
    if (overflow) *overflow = over;

    SECP256K1_SCALAR_VERIFY(r);
}